

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O0

void __thiscall cornerstone::raft_server::rm_srv_from_cluster(raft_server *this,int32 srv_id)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  element_type *peVar4;
  list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  *__s;
  element_type *this_00;
  element_type *peVar5;
  element_type *this_01;
  unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *args_1;
  int in_ESI;
  raft_server *in_RDI;
  ptr<log_entry> entry;
  bufptr new_conf_buf;
  const_srv_itor it;
  ptr<cluster_config> new_conf;
  list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  *in_stack_fffffffffffffe18;
  strfmt<200> *in_stack_fffffffffffffe20;
  value_type *in_stack_fffffffffffffe28;
  allocator<char> *args;
  list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe50;
  int32 in_stack_fffffffffffffe54;
  undefined1 local_178 [39];
  allocator<char> local_151 [25];
  cluster_config *in_stack_fffffffffffffec8;
  string local_80 [32];
  iterator local_60;
  _List_const_iterator<std::shared_ptr<cornerstone::srv_config>_> local_58 [3];
  iterator local_40;
  _List_const_iterator<std::shared_ptr<cornerstone::srv_config>_> local_38;
  ulong local_30;
  undefined8 local_28;
  int local_c;
  
  local_c = in_ESI;
  peVar3 = std::
           __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1da7bf);
  iVar2 = (*peVar3->_vptr_log_store[2])();
  local_28 = CONCAT44(extraout_var,iVar2);
  peVar4 = std::
           __shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1da7e9);
  local_30 = cluster_config::get_log_idx(peVar4);
  cs_new<cornerstone::cluster_config,unsigned_long,unsigned_long>
            ((unsigned_long *)in_stack_fffffffffffffe28,(unsigned_long *)in_stack_fffffffffffffe20);
  peVar4 = std::
           __shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1da820);
  cluster_config::get_servers_abi_cxx11_(peVar4);
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
       ::begin(in_stack_fffffffffffffe18);
  std::_List_const_iterator<std::shared_ptr<cornerstone::srv_config>_>::_List_const_iterator
            (&local_38,&local_40);
  while( true ) {
    peVar4 = std::
             __shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1da867);
    __s = cluster_config::get_servers_abi_cxx11_(peVar4);
    local_60._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
         ::end(in_stack_fffffffffffffe18);
    std::_List_const_iterator<std::shared_ptr<cornerstone::srv_config>_>::_List_const_iterator
              (local_58,&local_60);
    bVar1 = std::operator!=(&local_38,local_58);
    if (!bVar1) break;
    std::_List_const_iterator<std::shared_ptr<cornerstone::srv_config>_>::operator*
              ((_List_const_iterator<std::shared_ptr<cornerstone::srv_config>_> *)
               in_stack_fffffffffffffe20);
    this_00 = std::
              __shared_ptr_access<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1da8d0);
    in_stack_fffffffffffffe54 = srv_config::get_id(this_00);
    if (in_stack_fffffffffffffe54 != local_c) {
      peVar4 = std::
               __shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1da8f8);
      cluster_config::get_servers_abi_cxx11_(peVar4);
      std::_List_const_iterator<std::shared_ptr<cornerstone::srv_config>_>::operator*
                ((_List_const_iterator<std::shared_ptr<cornerstone::srv_config>_> *)
                 in_stack_fffffffffffffe20);
      std::__cxx11::
      list<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
      ::push_back(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    }
    std::_List_const_iterator<std::shared_ptr<cornerstone::srv_config>_>::operator++(&local_38);
  }
  peVar5 = std::__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1da963);
  strfmt<200>::strfmt((strfmt<200> *)(local_151 + 1),
                      "removed a server from configuration and save the configuration to log store at %llu"
                     );
  peVar4 = std::
           __shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1da98b);
  cluster_config::get_log_idx(peVar4);
  strfmt<200>::fmt<unsigned_long>
            (in_stack_fffffffffffffe20,(unsigned_long)in_stack_fffffffffffffe18);
  args = local_151;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,(char *)__s
             ,(allocator<char> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  (*peVar5->_vptr_logger[3])(peVar5,local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(local_151);
  in_RDI->config_changing_ = true;
  std::__shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<cornerstone::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1daa26);
  cluster_config::serialize(in_stack_fffffffffffffec8);
  this_01 = std::
            __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1daa49);
  args_1 = (unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)
           srv_state::get_term(this_01);
  cs_new<cornerstone::log_entry,unsigned_long,std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>,cornerstone::log_val_type>
            ((unsigned_long *)args,args_1,(log_val_type *)in_stack_fffffffffffffe18);
  peVar3 = std::
           __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1daa99);
  (*peVar3->_vptr_log_store[5])(peVar3,local_178);
  request_append_entries(in_RDI);
  std::shared_ptr<cornerstone::log_entry>::~shared_ptr
            ((shared_ptr<cornerstone::log_entry> *)0x1daac2);
  std::unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>::~unique_ptr(args_1);
  std::shared_ptr<cornerstone::cluster_config>::~shared_ptr
            ((shared_ptr<cornerstone::cluster_config> *)0x1daadc);
  return;
}

Assistant:

void raft_server::rm_srv_from_cluster(int32 srv_id)
{
    ptr<cluster_config> new_conf = cs_new<cluster_config>(log_store_->next_slot(), config_->get_log_idx());
    for (cluster_config::const_srv_itor it = config_->get_servers().begin(); it != config_->get_servers().end(); ++it)
    {
        if ((*it)->get_id() != srv_id)
        {
            new_conf->get_servers().push_back(*it);
        }
    }

    l_->info(lstrfmt("removed a server from configuration and save the configuration to log store at %llu")
                 .fmt(new_conf->get_log_idx()));
    config_changing_ = true;
    bufptr new_conf_buf(new_conf->serialize());
    ptr<log_entry> entry(cs_new<log_entry>(state_->get_term(), std::move(new_conf_buf), log_val_type::conf));
    log_store_->append(entry);
    request_append_entries();
}